

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O2

uint32_t aom_rb_read_unsigned_literal(aom_read_bit_buffer *rb,int bits)

{
  int iVar1;
  uint32_t value;
  uint uVar2;
  
  uVar2 = 0;
  while (0 < bits) {
    bits = bits + -1;
    iVar1 = aom_rb_read_bit(rb);
    uVar2 = uVar2 | iVar1 << ((byte)bits & 0x1f);
  }
  return uVar2;
}

Assistant:

uint32_t aom_rb_read_unsigned_literal(struct aom_read_bit_buffer *rb,
                                      int bits) {
  assert(bits <= 32);
  uint32_t value = 0;
  int bit;
  for (bit = bits - 1; bit >= 0; bit--)
    value |= (uint32_t)aom_rb_read_bit(rb) << bit;
  return value;
}